

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O1

bool __thiscall
duckdb::Linenoise::AddCompletionMarker
          (Linenoise *this,char *buf,idx_t len,string *result_buffer,
          vector<duckdb::highlightToken,_true> *tokens)

{
  pointer *pphVar1;
  byte *pbVar2;
  ulong uVar3;
  iterator __position;
  void *pvVar4;
  char cVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  idx_t cpos;
  size_t sVar9;
  bool bVar10;
  highlightToken completion_token;
  TabCompletion completion;
  highlightToken local_68;
  TabCompletion local_48;
  
  if (enableCompletionRendering != '\x01') {
    return false;
  }
  if (999 < len) {
    return false;
  }
  if (this->continuation_markers == false) {
    return false;
  }
  if (this->insert != true) {
    return false;
  }
  if (this->pos < 3 || this->pos != len) {
    return false;
  }
  if (((tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pvVar6 = vector<duckdb::highlightToken,_true>::back(tokens), pvVar6->type == TOKEN_ERROR)) {
    return false;
  }
  uVar3 = this->pos;
  bVar10 = 2 < uVar3;
  if (bVar10) {
    if ((buf[uVar3 - 3] == 0x5f) || ((byte)((buf[uVar3 - 3] & 0xdfU) + 0xbf) < 0x1a)) {
      uVar8 = uVar3 - 2;
      do {
        bVar10 = uVar8 < uVar3;
        if (!bVar10) goto LAB_00226935;
        pbVar2 = (byte *)(buf + uVar8);
        uVar8 = uVar8 + 1;
      } while ((*pbVar2 == 0x5f) || ((byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a));
    }
    if (bVar10) {
      return false;
    }
  }
LAB_00226935:
  TabComplete(&local_48,this);
  if ((local_48.completions.super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
       super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_48.completions.super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
       super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_48.completions,0),
     len < (pvVar7->completion)._M_string_length)) {
    sVar9 = this->pos;
    do {
      if (sVar9 == 0) {
        cVar5 = '\x05';
        break;
      }
      if ((buf[sVar9 - 1] == 0x5f) || ((byte)((buf[sVar9 - 1] & 0xdfU) + 0xbf) < 0x1a)) {
        pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_48.completions,0);
        bVar10 = (pvVar7->completion)._M_dataplus._M_p[sVar9 - 1] == buf[sVar9 - 1];
        cVar5 = !bVar10;
      }
      else {
        bVar10 = false;
        cVar5 = '\x05';
      }
      sVar9 = sVar9 - 1;
    } while (bVar10);
    if (cVar5 == '\x05') {
      pvVar4 = (void *)((long)&local_68 + 0x10);
      local_68._0_8_ = pvVar4;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,buf,buf + len);
      ::std::__cxx11::string::operator=((string *)result_buffer,(string *)&local_68);
      if ((void *)local_68._0_8_ != pvVar4) {
        operator_delete((void *)local_68._0_8_);
      }
      pvVar7 = vector<duckdb::Completion,_true>::operator[](&local_48.completions,0);
      ::std::__cxx11::string::substr((ulong)&local_68,(ulong)pvVar7);
      ::std::__cxx11::string::_M_append((char *)result_buffer,local_68._0_8_);
      if ((void *)local_68._0_8_ != pvVar4) {
        operator_delete((void *)local_68._0_8_);
      }
      local_68.type = TOKEN_COMMENT;
      local_68.search_match = true;
      __position._M_current =
           (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_68.start = len;
      if (__position._M_current ==
          (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
        _M_realloc_insert<duckdb::highlightToken_const&>
                  ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)tokens,
                   __position,&local_68);
      }
      else {
        *(ulong *)&(__position._M_current)->search_match = CONCAT71(local_68._17_7_,1);
        (__position._M_current)->type = TOKEN_COMMENT;
        *(undefined7 *)&(__position._M_current)->field_0x1 = local_68._1_7_;
        (__position._M_current)->start = len;
        pphVar1 = &(tokens->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pphVar1 = *pphVar1 + 1;
      }
      bVar10 = true;
      goto LAB_00226a6d;
    }
  }
  bVar10 = false;
LAB_00226a6d:
  ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::~vector
            ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)&local_48);
  return bVar10;
}

Assistant:

bool Linenoise::AddCompletionMarker(const char *buf, idx_t len, string &result_buffer,
                                    vector<highlightToken> &tokens) const {
	if (!enableCompletionRendering) {
		return false;
	}
	if (!continuation_markers) {
		// don't render when pressing ctrl+c, only when editing
		return false;
	}
	static constexpr const idx_t MAX_COMPLETION_LENGTH = 1000;
	if (len >= MAX_COMPLETION_LENGTH) {
		return false;
	}
	if (!insert || pos != len) {
		// only show when inserting a character at the end
		return false;
	}
	if (pos < 3) {
		// we need at least 3 bytes
		return false;
	}
	if (!tokens.empty() && tokens.back().type == tokenType::TOKEN_ERROR) {
		// don't show auto-completion when we have errors
		return false;
	}
	// we ONLY show completion if we have typed at least three characters that are supported for completion
	// for now this is ONLY the characters a-z, A-Z and underscore (_)
	for (idx_t i = pos - 3; i < pos; i++) {
		if (!IsCompletionCharacter(buf[i])) {
			return false;
		}
	}
	auto completion = TabComplete();
	if (completion.completions.empty()) {
		// no completions found
		return false;
	}
	if (completion.completions[0].completion.size() <= len) {
		// completion is not long enough
		return false;
	}
	// we have stricter requirements for rendering completions - the completion must match exactly
	for (idx_t i = pos; i > 0; i--) {
		auto cpos = i - 1;
		if (!IsCompletionCharacter(buf[cpos])) {
			break;
		}
		if (completion.completions[0].completion[cpos] != buf[cpos]) {
			return false;
		}
	}
	// add the first completion found for rendering purposes
	result_buffer = string(buf, len);
	result_buffer += completion.completions[0].completion.substr(len);

	highlightToken completion_token;
	completion_token.start = len;
	completion_token.type = tokenType::TOKEN_COMMENT;
	completion_token.search_match = true;
	tokens.push_back(completion_token);
	return true;
}